

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void sqlite3VtabBeginParse
               (Parse *pParse,Token *pName1,Token *pName2,Token *pModuleName,int ifNotExists)

{
  Table *pTable;
  sqlite3 *db;
  Schema *pSVar1;
  char *pcVar2;
  Schema **ppSVar3;
  long lVar4;
  
  sqlite3StartTable(pParse,pName1,pName2,0,0,1,ifNotExists);
  pTable = pParse->pNewTable;
  if (pTable != (Table *)0x0) {
    db = pParse->db;
    pcVar2 = sqlite3NameFromToken(db,pModuleName);
    addModuleArgument(pParse,pTable,pcVar2);
    addModuleArgument(pParse,pTable,(char *)0x0);
    pcVar2 = sqlite3DbStrDup(db,pTable->zName);
    addModuleArgument(pParse,pTable,pcVar2);
    (pParse->sNameToken).n =
         (*(int *)&pModuleName->z + pModuleName->n) - *(int *)&(pParse->sNameToken).z;
    if (pTable->azModuleArg != (char **)0x0) {
      if (pTable->pSchema == (Schema *)0x0) {
        lVar4 = -1000000;
      }
      else {
        lVar4 = -0x100000000;
        ppSVar3 = &db->aDb->pSchema;
        do {
          lVar4 = lVar4 + 0x100000000;
          pSVar1 = *ppSVar3;
          ppSVar3 = ppSVar3 + 4;
        } while (pSVar1 != pTable->pSchema);
        lVar4 = lVar4 >> 0x20;
      }
      sqlite3AuthCheck(pParse,0x1d,pTable->zName,*pTable->azModuleArg,
                       pParse->db->aDb[lVar4].zDbSName);
      return;
    }
  }
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3VtabBeginParse(
  Parse *pParse,        /* Parsing context */
  Token *pName1,        /* Name of new table, or database name */
  Token *pName2,        /* Name of new table or NULL */
  Token *pModuleName,   /* Name of the module for the virtual table */
  int ifNotExists       /* No error if the table already exists */
){
  Table *pTable;        /* The new virtual table */
  sqlite3 *db;          /* Database connection */

  sqlite3StartTable(pParse, pName1, pName2, 0, 0, 1, ifNotExists);
  pTable = pParse->pNewTable;
  if( pTable==0 ) return;
  assert( 0==pTable->pIndex );

  db = pParse->db;

  assert( pTable->nModuleArg==0 );
  addModuleArgument(pParse, pTable, sqlite3NameFromToken(db, pModuleName));
  addModuleArgument(pParse, pTable, 0);
  addModuleArgument(pParse, pTable, sqlite3DbStrDup(db, pTable->zName));
  assert( (pParse->sNameToken.z==pName2->z && pName2->z!=0)
       || (pParse->sNameToken.z==pName1->z && pName2->z==0)
  );
  pParse->sNameToken.n = (int)(
      &pModuleName->z[pModuleName->n] - pParse->sNameToken.z
  );

#ifndef SQLITE_OMIT_AUTHORIZATION
  /* Creating a virtual table invokes the authorization callback twice.
  ** The first invocation, to obtain permission to INSERT a row into the
  ** sqlite_master table, has already been made by sqlite3StartTable().
  ** The second call, to obtain permission to create the table, is made now.
  */
  if( pTable->azModuleArg ){
    int iDb = sqlite3SchemaToIndex(db, pTable->pSchema);
    assert( iDb>=0 ); /* The database the table is being created in */
    sqlite3AuthCheck(pParse, SQLITE_CREATE_VTABLE, pTable->zName, 
            pTable->azModuleArg[0], pParse->db->aDb[iDb].zDbSName);
  }
#endif
}